

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::parseSelectors(string_view *input,SelectorList *selectors)

{
  bool bVar1;
  undefined1 local_38 [8];
  Selector selector;
  SelectorList *selectors_local;
  string_view *input_local;
  
  selector.super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)selectors;
  do {
    std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::vector
              ((vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *)local_38
              );
    bVar1 = parseSelector(input,(vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                                 *)local_38);
    if (bVar1) {
      std::
      vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
      ::push_back((vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                   *)selector.
                     super__Vector_base<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_38);
    }
    else {
      input_local._7_1_ = 0;
    }
    std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>::~vector
              ((vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_> *)local_38
              );
    if (!bVar1) goto LAB_0013d072;
    bVar1 = skipDelimiterAndOptionalSpaces(input,',');
  } while (bVar1);
  input_local._7_1_ = 1;
LAB_0013d072:
  return (bool)(input_local._7_1_ & 1);
}

Assistant:

static bool parseSelectors(std::string_view& input, SelectorList& selectors)
{
    do {
        Selector selector;
        if(!parseSelector(input, selector))
            return false;
        selectors.push_back(std::move(selector));
    } while(skipDelimiterAndOptionalSpaces(input, ','));
    return true;
}